

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_strnspc(char *s,char *n,size_t len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *p;
  
  for (pcVar2 = s; pcVar3 = n, pcVar2 < s + len; pcVar2 = pcVar2 + 1) {
    while (cVar1 = *pcVar3, cVar1 != '\0') {
      pcVar3 = pcVar3 + 1;
      if (*pcVar2 == cVar1) goto LAB_00106385;
    }
  }
LAB_00106385:
  return (long)pcVar2 - (long)s;
}

Assistant:

size_t coda_strnspc(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return p - s;
		}
	}

	return p - s;
}